

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall CharScanner::CharScanner(CharScanner *this,InputBuffer *cb)

{
  CharScanner *in_RDI;
  InputBuffer *in_stack_ffffffffffffff98;
  LexerInputState *this_00;
  allocator_type *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_02;
  CharScannerLiteralsLess local_18 [3];
  
  TokenStream::TokenStream(&in_RDI->super_TokenStream);
  (in_RDI->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_0036c748;
  this_01 = (allocator_type *)&in_RDI->text;
  std::__cxx11::string::string((string *)this_01);
  in_RDI->saveConsumedInput = true;
  this_02 = &in_RDI->literals;
  CharScannerLiteralsLess::CharScannerLiteralsLess(local_18,in_RDI);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *)0x29031a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(this_02,(CharScannerLiteralsLess *)in_RDI,this_01);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *)0x29033a);
  RefCount<Token>::RefCount((RefCount<Token> *)this_02,(Token *)in_RDI);
  this_00 = (LexerInputState *)&in_RDI->inputState;
  operator_new(0x38);
  LexerInputState::LexerInputState(this_00,in_stack_ffffffffffffff98);
  RefCount<LexerInputState>::RefCount
            ((RefCount<LexerInputState> *)this_02,(LexerInputState *)in_RDI);
  in_RDI->commitToPath = false;
  (*(in_RDI->super_TokenStream)._vptr_TokenStream[0x25])(in_RDI,CommonToken::factory);
  return;
}

Assistant:

CharScanner::CharScanner(InputBuffer& cb)
	: saveConsumedInput(true) //, caseSensitiveLiterals(true)
	, literals(CharScannerLiteralsLess(this))
	, inputState(new LexerInputState(cb))
	, commitToPath(false)
{
	setTokenObjectFactory(&CommonToken::factory);
}